

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O2

sexp_conflict
sexp_bit_set_p(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict i,sexp_conflict x)

{
  sexp_conflict psVar1;
  ulong uVar2;
  
  if (((ulong)i & 1) == 0) {
    psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,2,i);
    return psVar1;
  }
  uVar2 = (long)i >> 1;
  if (-1 < (long)uVar2) {
    if (((ulong)x & 1) == 0) {
      if ((((ulong)x & 2) != 0) || (x->tag != 0xc)) {
        psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,2,x);
        return psVar1;
      }
      if ((long)(uVar2 >> 6) < (x->value).fileno.fd) {
        uVar2 = 1L << ((byte)uVar2 & 0x3f) & *(ulong *)((long)&x->value + (uVar2 >> 6) * 8 + 0x10);
      }
      else {
        uVar2 = (ulong)((byte)(x->value).flonum_bits[0] >> 7);
      }
    }
    else if (uVar2 < 0x40) {
      uVar2 = 1L << ((byte)uVar2 & 0x3f) & (long)x >> 1;
    }
    else {
      uVar2 = (ulong)x >> 0x3f;
    }
    return (sexp_conflict)((ulong)(uVar2 != 0) << 8 | 0x3e);
  }
  psVar1 = (sexp_conflict)sexp_xtype_exception(ctx,self,"index must be non-negative",i);
  return psVar1;
}

Assistant:

sexp sexp_bit_set_p (sexp ctx, sexp self, sexp_sint_t n, sexp i, sexp x) {
  sexp_sint_t pos;
#if SEXP_USE_BIGNUMS
  sexp_sint_t rem;
#endif
  if (! sexp_fixnump(i))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, i);
  pos = sexp_unbox_fixnum(i);
  if (pos < 0)
    return sexp_xtype_exception(ctx, self, "index must be non-negative", i);
  if (sexp_fixnump(x)) {
    return sexp_make_boolean((pos < sizeof(sexp_uint_t)*CHAR_BIT)
                             ? (sexp_unbox_fixnum(x) & ((sexp_uint_t)1<<pos))
                             : sexp_unbox_fixnum(x) < 0);
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(x)) {
    pos /= (sizeof(sexp_uint_t)*CHAR_BIT);
    rem = (sexp_unbox_fixnum(i) - pos*sizeof(sexp_uint_t)*CHAR_BIT);
    return sexp_make_boolean((pos < (sexp_sint_t)sexp_bignum_length(x))
                             ? (sexp_bignum_data(x)[pos] & ((sexp_uint_t)1<<rem))
                             : sexp_bignum_sign(x) < 0);
#endif
  } else {
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
}